

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O1

bool __thiscall
jaegertracing::anon_unknown_11::SamplingPriorityVisitor::operator()
          (SamplingPriorityVisitor *this,string *str)

{
  byte bVar1;
  bool bVar2;
  long *plVar3;
  int intValue;
  istringstream iss;
  int local_18c;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  std::__cxx11::istringstream::istringstream(local_188,(string *)this,_S_in);
  local_18c = 0;
  plVar3 = (long *)std::istream::operator>>((istream *)local_188,&local_18c);
  bVar1 = *(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20);
  bVar2 = 0 < local_18c;
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  return bVar2 && (bVar1 & 5) == 0;
}

Assistant:

bool operator()(const std::string& str) const
    {
        std::istringstream iss(str);
        auto intValue = 0;
        if (!(iss >> intValue)) {
            return false;
        }
        return intValue > 0;
    }